

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemv.hpp
# Opt level: O1

void remora::bindings::
     gemv_impl<remora::dense_vector_adaptor<double,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::dense_vector_adaptor<double_const,remora::continuous_dense_tag,remora::cpu_tag>>
               (double alpha,long *A,undefined8 *x,long *result)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  double dVar8;
  
  lVar1 = A[1];
  if (lVar1 != 0) {
    lVar2 = A[2];
    lVar3 = x[2];
    lVar4 = 0;
    lVar5 = 0;
    do {
      dVar8 = 0.0;
      if (lVar2 != 0) {
        pdVar6 = (double *)*x;
        lVar7 = 0;
        do {
          dVar8 = dVar8 + *(double *)(A[3] * lVar4 + *A + lVar7 * 8) * *pdVar6;
          lVar7 = lVar7 + 1;
          pdVar6 = pdVar6 + lVar3;
        } while (lVar2 != lVar7);
      }
      if ((dVar8 != 0.0) || (NAN(dVar8))) {
        *(double *)(*result + result[2] * lVar5 * 8) =
             dVar8 * alpha + *(double *)(*result + result[2] * lVar5 * 8);
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 8;
    } while (lVar5 != lVar1);
  }
  return;
}

Assistant:

void gemv_impl(
	matrix_expression<MatA, cpu_tag> const& A,
	vector_expression<V, cpu_tag> const& x,
	vector_expression<ResultV, cpu_tag>& result, 
	typename ResultV::value_type alpha,
	row_major
) {
	typedef typename ResultV::value_type value_type;
	value_type value;
	for(std::size_t i = 0; i != A().size1();++i){
		bindings::dot(row(A,i), x, value,  typename MatA::evaluation_category::tag(), typename V::evaluation_category::tag());
		if(value != value_type())//handling of sparse results.
			result()(i) += alpha * value;
	}
}